

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::addAssign
          (TParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,TIntermTyped *right)

{
  bool bVar1;
  int iVar2;
  TIntermTyped *pTVar3;
  TIntermTyped *right_local;
  TIntermTyped *left_local;
  TOperator op_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if (((op == EOpAddAssign) || (op == EOpSubAssign)) &&
     (bVar1 = TIntermTyped::isReference(left), bVar1)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_buffer_reference2,"+= and -= on a buffer reference");
  }
  if (((op == EOpAssign) &&
      (iVar2 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 0xe)) &&
     (iVar2 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 0xe)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"sampler assignment for bindless texture");
  }
  pTVar3 = TIntermediate::addAssign
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,left,
                      right,loc);
  return pTVar3;
}

Assistant:

TIntermTyped* TParseContext::addAssign(const TSourceLoc& loc, TOperator op, TIntermTyped* left, TIntermTyped* right)
{
    if ((op == EOpAddAssign || op == EOpSubAssign) && left->isReference())
        requireExtensions(loc, 1, &E_GL_EXT_buffer_reference2, "+= and -= on a buffer reference");

    if (op == EOpAssign && left->getBasicType() == EbtSampler && right->getBasicType() == EbtSampler)
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "sampler assignment for bindless texture");

    return intermediate.addAssign(op, left, right, loc);
}